

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O1

duckdb_aggregate_function_set duckdb_create_aggregate_function_set(char *name)

{
  duckdb_aggregate_function_set this;
  size_t sVar1;
  string local_38;
  
  if ((name == (char *)0x0) || (*name == '\0')) {
    this = (duckdb_aggregate_function_set)0x0;
  }
  else {
    this = (duckdb_aggregate_function_set)operator_new(0x38);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    sVar1 = strlen(name);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,name,name + sVar1);
    duckdb::AggregateFunctionSet::AggregateFunctionSet((AggregateFunctionSet *)this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return this;
}

Assistant:

duckdb_aggregate_function_set duckdb_create_aggregate_function_set(const char *name) {
	if (!name || !*name) {
		return nullptr;
	}
	auto function_set = new duckdb::AggregateFunctionSet(name);
	return reinterpret_cast<duckdb_aggregate_function_set>(function_set);
}